

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void decompose(uint32_t n)

{
  uint uVar1;
  ulong uVar3;
  ulong uVar2;
  
  printf("%u = ",(ulong)n);
  if (n != 0) {
    printf("%d*10^%d",(ulong)(n % 10),0);
    if (9 < n) {
      uVar3 = 1;
      uVar2 = (ulong)n;
      do {
        uVar1 = (uint)uVar2;
        printf(" + ");
        printf("%d*10^%d",(ulong)(uint)((int)(uVar2 / 10) + (int)(uVar2 / 100) * -10),uVar3);
        uVar3 = (ulong)((int)uVar3 + 1);
        uVar2 = uVar2 / 10;
      } while (99 < uVar1);
    }
  }
  putchar(10);
  return;
}

Assistant:

void decompose(uint32_t n) {
  printf("%" PRIu32 " = ", n);
  for (int i = 0; n; i++) {
    printf("%d*10^%d", n % 10, i);
    n /= 10;
    if (n) printf(" + ");
  }
  printf("\n");
}